

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.cc
# Opt level: O0

void __thiscall trng::mrg2::mrg2(mrg2 *this,unsigned_long s,parameter_type P)

{
  undefined8 in_RDX;
  unsigned_long in_RSI;
  mrg2 *in_RDI;
  
  *(undefined8 *)(in_RDI->P).a = in_RDX;
  mrg_status<int,_2,_trng::mrg2>::mrg_status(&in_RDI->S);
  seed(in_RDI,in_RSI);
  return;
}

Assistant:

mrg2::mrg2(unsigned long s, mrg2::parameter_type P) : P{P} { seed(s); }